

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVectorBase<slang::ast::EvalContext::Frame>::cleanup
          (SmallVectorBase<slang::ast::EvalContext::Frame> *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  __destroy_fn *unaff_retaddr;
  
  std::ranges::__destroy_fn::operator()<slang::SmallVectorBase<slang::ast::EvalContext::Frame>_&>
            (unaff_retaddr,this);
  bVar1 = isSmall(this);
  if (!bVar1) {
    operator_delete((void *)0x38e20a);
  }
  return;
}

Assistant:

void cleanup() {
        std::ranges::destroy(*this);
        if (!isSmall())
            ::operator delete(data_);
    }